

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int checkmonth(char *check)

{
  bool bVar1;
  int iVar2;
  int local_28;
  char **ppcStack_20;
  _Bool found;
  char **what;
  int i;
  char *check_local;
  
  bVar1 = false;
  ppcStack_20 = Curl_month;
  what._4_4_ = 0;
  do {
    if (0xb < what._4_4_) {
LAB_00954e3a:
      if (bVar1) {
        local_28 = what._4_4_;
      }
      else {
        local_28 = -1;
      }
      return local_28;
    }
    iVar2 = Curl_strcasecompare(check,*ppcStack_20);
    if (iVar2 != 0) {
      bVar1 = true;
      goto LAB_00954e3a;
    }
    ppcStack_20 = ppcStack_20 + 1;
    what._4_4_ = what._4_4_ + 1;
  } while( true );
}

Assistant:

static int checkmonth(const char *check)
{
  int i;
  const char * const *what;
  bool found = FALSE;

  what = &Curl_month[0];
  for(i = 0; i<12; i++) {
    if(strcasecompare(check, what[0])) {
      found = TRUE;
      break;
    }
    what++;
  }
  return found?i:-1; /* return the offset or -1, no real offset is -1 */
}